

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::one_thread::impl::
data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::set_data_sources_name_base
          (data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,string *name_base,void *disp_this_pointer)

{
  pointer pcVar1;
  string local_70;
  prefix_t local_50;
  
  pcVar1 = (name_base->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + name_base->_M_string_length);
  reuse::make_disp_prefix(&local_50,"ot",&local_70,disp_this_pointer);
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x10) = local_50.m_value._16_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x18) = local_50.m_value._24_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x20) = local_50.m_value._32_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x28) = local_50.m_value._40_8_;
  *(undefined8 *)
   (this->
   super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
   ).m_base_prefix.m_value = local_50.m_value._0_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 8) = local_50.m_value._8_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x10) = local_50.m_value._16_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x18) = local_50.m_value._24_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  reuse::make_disp_working_thread_prefix
            (&local_50,
             &(this->
              super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
              ).m_base_prefix,0);
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x10) = local_50.m_value._16_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x18) = local_50.m_value._24_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x20) = local_50.m_value._32_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x28) = local_50.m_value._40_8_;
  *(undefined8 *)
   (this->
   super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
   ).m_work_thread_prefix.m_value = local_50.m_value._0_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 8) = local_50.m_value._8_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x10) = local_50.m_value._16_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x18) = local_50.m_value._24_8_;
  return;
}

Assistant:

void
		set_data_sources_name_base(
			const std::string & name_base,
			const void * disp_this_pointer )
			{
				using namespace so_5::disp::reuse;

				this->m_base_prefix = make_disp_prefix(
						"ot", // ot -- one_thread
						name_base,
						disp_this_pointer );

				this->m_work_thread_prefix = make_disp_working_thread_prefix(
						this->m_base_prefix,
						0 );
			}